

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O2

void FastPForLib::__unpack_tight<9u,true>(uint32_t *in,uint32_t *out)

{
  uint32_t pointer;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  pointer._0_1_ = true;
  while (pointer._0_1_) {
    for (uVar1 = 0; uVar1 < 0x120; uVar1 = uVar1 + 9) {
      uVar3 = uVar1 & 0x1f;
      uVar2 = in[uVar1 >> 5] >> uVar3;
      *out = uVar2;
      if (0x17 < uVar3) {
        uVar2 = uVar2 | in[(ulong)(uVar1 >> 5) + 1] << ((byte)-(char)uVar3 & 0x1f);
      }
      *out = uVar2 & 0x1ff;
      out = out + 1;
    }
    in = in + 9;
    pointer._0_1_ = false;
  }
  return;
}

Assistant:

void __unpack_tight(const uint32_t *__restrict__ in,
                    uint32_t *__restrict__ out) {
  assert(bit <= 32);
  if (bit == 32) {
    for (int k = 0; k < 32; ++k) {
      out[k] = in[k];
    }
    return;
  }
  if (bit == 16) {
    for (uint32_t outer = 0; outer < 16; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }
  if (bit == 8) {
    for (uint32_t outer = 0; outer < 8; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 8)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }

#if !defined(_MSC_VER) && !defined(__INTEL_COMPILER)
  enum { mygcd = gcd(bit, 32) };
#else
  const uint32_t mygcd = gcd(bit, 32);
#endif

  for (uint32_t t = 0; t < mygcd; ++t) {
    for (uint32_t pointer = 0; pointer < 32 * bit / mygcd; pointer += bit) {
      const uint32_t inword = (pointer % 32);
      *out = in[pointer / 32] >> inword;
      if (inword > 32 - bit)
        *out |= (in[pointer / 32 + 1] << (32 - inword));
      *out = __bitmask<bit, mask>(*out);
      ++out;
    }
    in += bit / mygcd;
  }
  return;
}